

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

void __thiscall Cpu::Cpu(Cpu *this)

{
  this->rtcc = this->RAM + 1;
  this->status = this->RAM + 3;
  this->fsr = this->RAM + 4;
  this->ra = this->RAM + 5;
  this->rb = this->RAM + 6;
  this->rc = this->RAM + 7;
  this->rd = this->RAM + 8;
  this->re = this->RAM + 9;
  this->w = this->RAM + 0x105;
  reset(this);
  return;
}

Assistant:

Cpu::Cpu ()
{
	rtcc = &RAM[1];
	status = &RAM[3];
	fsr = &RAM[4];
	ra = &RAM[5];
	rb = &RAM[6];
	rc = &RAM[7];
	rd = &RAM[8];
	re = &RAM[9];
	w = &RAM[261];
	reset();
}